

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

void __thiscall cmFileInstaller::ReportCopy(cmFileInstaller *this,char *toFile,Type type,bool copy)

{
  char *pcVar1;
  string message;
  allocator local_41;
  string local_40;
  
  if (this->MessageNever == false) {
    if (copy) {
      pcVar1 = "Installing: ";
    }
    else {
      if (this->MessageLazy != false) goto LAB_00301f27;
      pcVar1 = "Up-to-date: ";
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar1,pcVar1 + 0xc);
    std::__cxx11::string::append((char *)&local_40);
    cmMakefile::DisplayStatus((this->super_cmFileCopier).Makefile,local_40._M_dataplus._M_p,-1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00301f27:
  if (type != TypeDir) {
    std::__cxx11::string::string((string *)&local_40,toFile,&local_41);
    ManifestAppend(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ReportCopy(const char* toFile, Type type, bool copy) CM_OVERRIDE
  {
    if (!this->MessageNever && (copy || !this->MessageLazy)) {
      std::string message = (copy ? "Installing: " : "Up-to-date: ");
      message += toFile;
      this->Makefile->DisplayStatus(message.c_str(), -1);
    }
    if (type != TypeDir) {
      // Add the file to the manifest.
      this->ManifestAppend(toFile);
    }
  }